

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Lambda * skiwi::make_lambda(Lambda *__return_storage_ptr__,
                           vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  string *__lhs;
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  pointer ptVar5;
  variant_alternative_t<0UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar6;
  pointer ptVar7;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_00;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_01;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_02;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  int iVar8;
  string local_258;
  string local_238;
  string local_218;
  string name;
  string local_1d8;
  token tok;
  Begin b;
  string local_70;
  string local_50;
  
  ptVar7 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar7 == ptVar5) {
    anon_unknown_2::throw_parse_error(no_tokens);
    ptVar7 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ptVar5 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((ptVar7 == ptVar5) || (ptVar5[-1].type != T_ID)) {
    iVar8 = ptVar5[-1].line_nr;
    iVar1 = ptVar5[-1].column_nr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"",(allocator<char> *)&tok);
    anon_unknown_2::throw_parse_error(iVar8,iVar1,bad_syntax,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  Lambda::Lambda(__return_storage_ptr__);
  ptVar7 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = ptVar7[-1].column_nr;
  __return_storage_ptr__->line_nr = ptVar7[-1].line_nr;
  __return_storage_ptr__->column_nr = iVar8;
  (anonymous_namespace)::current_abi_cxx11_(&name,(_anonymous_namespace_ *)tokens,tokens_00);
  __return_storage_ptr__->variable_arity = false;
  bVar3 = std::operator!=(&name,"lambda");
  if (bVar3) {
    ptVar7 = (tokens->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar8 = ptVar7[-1].line_nr;
    iVar1 = ptVar7[-1].column_nr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"lambda",(allocator<char> *)&tok);
    anon_unknown_2::throw_parse_error(iVar8,iVar1,expected_keyword,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  anon_unknown_2::advance(tokens);
  (anonymous_namespace)::current_abi_cxx11_
            ((string *)&tok,(_anonymous_namespace_ *)tokens,tokens_01);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok,
                          "(");
  std::__cxx11::string::~string((string *)&tok);
  if (bVar3) {
    __return_storage_ptr__->variable_arity = true;
    anon_unknown_2::take(&tok,tokens);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->variables,&tok.value);
    std::__cxx11::string::~string((string *)&tok.value);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"(",(allocator<char> *)&tok);
    anon_unknown_2::require(tokens,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    __lhs = &tok.value;
    iVar8 = 0;
    tokens_02 = extraout_RDX;
    while( true ) {
      (anonymous_namespace)::current_abi_cxx11_
                ((string *)&tok,(_anonymous_namespace_ *)tokens,tokens_02);
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tok,")");
      std::__cxx11::string::~string((string *)&tok);
      bVar3 = __return_storage_ptr__->variable_arity;
      if (!bVar4) break;
      anon_unknown_2::take(&tok,tokens);
      if (tok.type != T_ID) {
        bVar4 = std::operator!=(__lhs,".");
        iVar2 = tok.column_nr;
        iVar1 = tok.line_nr;
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"",(allocator<char> *)&b);
          anon_unknown_2::throw_parse_error(iVar1,iVar2,invalid_argument,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      bVar4 = std::operator==(__lhs,".");
      iVar2 = tok.column_nr;
      iVar1 = tok.line_nr;
      if (bVar4) {
        if (__return_storage_ptr__->variable_arity == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"",(allocator<char> *)&b);
          anon_unknown_2::throw_parse_error(iVar1,iVar2,invalid_argument,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
        }
        __return_storage_ptr__->variable_arity = true;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->variables,__lhs);
      }
      iVar8 = iVar8 + (uint)bVar3;
      std::__cxx11::string::~string((string *)__lhs);
      tokens_02 = extraout_RDX_00;
    }
    if ((iVar8 != 1 & bVar3) == 1) {
      iVar8 = __return_storage_ptr__->line_nr;
      iVar1 = __return_storage_ptr__->column_nr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"",(allocator<char> *)&tok);
      anon_unknown_2::throw_parse_error(iVar8,iVar1,invalid_argument,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
    }
    anon_unknown_2::advance(tokens);
  }
  b.filename._M_dataplus._M_p = (pointer)&b.filename.field_2;
  b.line_nr = -1;
  b.column_nr = -1;
  b.arguments.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b.arguments.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  b.arguments.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  b.arguments.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  b._25_8_ = 0;
  b.pre_scan_index = 0;
  b.scan_index = 0;
  b.filename._M_string_length = 0;
  b.filename.field_2._M_local_buf[0] = '\0';
  make_begin((Begin *)&tok,tokens,true);
  Begin::operator=(&b,(Begin *)&tok);
  while( true ) {
    Begin::~Begin((Begin *)&tok);
    if ((CONCAT71(b.arguments.
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  b.arguments.
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
         (long)b.arguments.
               super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0xf0) ||
       (((b.arguments.
          super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        ).
        super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        .
        super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
        ._M_index != '\0')) break;
    pvVar6 = std::
             get<0ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                       (b.arguments.
                        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    Begin::Begin((Begin *)&tok,pvVar6);
    Begin::operator=(&b,(Begin *)&tok);
  }
  std::__detail::__variant::
  _Variant_storage<false,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  ::_Variant_storage<0ul,skiwi::Begin&>
            ((_Variant_storage<false,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              *)&tok,&b);
  std::
  vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
  ::
  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>
            ((vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
              *)&__return_storage_ptr__->body,
             (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
              *)&tok);
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage((_Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)&tok);
  Begin::~Begin(&b);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

Lambda make_lambda(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Lambda l;
  l.line_nr = tokens.back().line_nr;
  l.column_nr = tokens.back().column_nr;
  std::string name = current(tokens);
  l.variable_arity = false;
  if (name != "lambda")
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, expected_keyword, "lambda");
  advance(tokens);
  if (current(tokens) != "(") // rest argument
    {
    l.variable_arity = true;
    auto tok = take(tokens);
    l.variables.emplace_back(tok.value);
    }
  else
    {
    require(tokens, "(");
    int count_after_var = 0;
    while (current(tokens) != ")")
      {
      if (l.variable_arity)
        ++count_after_var;
      auto tok = take(tokens);
      if (tok.type != token::T_ID && tok.value != ".")
        throw_parse_error(tok.line_nr, tok.column_nr, invalid_argument);
      if (tok.value == ".")
        {
        if (l.variable_arity)
          throw_parse_error(tok.line_nr, tok.column_nr, invalid_argument);
        l.variable_arity = true;
        }
      else
        l.variables.emplace_back(tok.value);
      }
    if (l.variable_arity && (count_after_var != 1))
      throw_parse_error(l.line_nr, l.column_nr, invalid_argument);
    advance(tokens);
    }
  Begin b;
  b = make_begin(tokens, true);
  while (b.arguments.size() == 1 && std::holds_alternative<Begin>(b.arguments.front()))
    {
    Begin beg = std::get<Begin>(b.arguments.front());
    b = beg;
    }
  l.body.push_back(b);
  return l;
  }